

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturedmesh.cc
# Opt level: O1

void __thiscall gvr::TexturedMesh::loadPLY(TexturedMesh *this,PLYReader *ply)

{
  string *this_00;
  string *this_01;
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t *psVar4;
  char *__s;
  char *pcVar5;
  bool bVar6;
  TexturedMesh *pTVar7;
  PLYReader *pPVar8;
  ply_type pVar9;
  ply_type pVar10;
  ply_type pVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  FloatArrayReceiver ss;
  FloatArrayReceiver vx;
  FloatArrayReceiver tv;
  FloatArrayReceiver tu;
  FloatArrayReceiver ny;
  FloatArrayReceiver nx;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  TriangleReceiver tr;
  FloatArrayReceiver nz;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  string local_3f8;
  string local_3d8;
  TexturedMesh *local_3b8;
  PLYReader *local_3b0;
  FloatArrayReceiver local_3a8;
  FloatArrayReceiver local_388;
  FloatArrayReceiver local_368;
  FloatArrayReceiver local_348;
  FloatArrayReceiver local_328;
  FloatArrayReceiver local_308;
  FloatArrayReceiver local_2e8;
  FloatArrayReceiver local_2c8;
  FloatArrayReceiver local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  FloatArrayReceiver local_268;
  FloatArrayReceiver local_248;
  long local_228;
  PLYReceiver local_220;
  TexturedMesh *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  FloatArrayReceiver local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_388.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_228 = PLYReader::instancesOfElement(ply,(string *)&local_388);
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_388.size) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY((Model *)this,ply);
  this_00 = &this->basepath;
  local_3b8 = this;
  std::__cxx11::string::_M_replace
            ((ulong)this_00,0,(char *)(this->basepath)._M_string_length,0x128467);
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b0 = ply;
  PLYReader::getComments(ply,&local_288);
  if (local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_01 = &local_3b8->name;
    lVar13 = 0;
    uVar14 = 0;
    do {
      lVar12 = std::__cxx11::string::find
                         ((char *)((long)&((local_288.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar13),0x128b04,0);
      if (lVar12 == 0) {
        bVar15 = true;
      }
      else {
        lVar12 = std::__cxx11::string::find
                           ((char *)((long)&((local_288.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar13),0x128b10,0);
        bVar15 = lVar12 == 0;
      }
      if (bVar15) {
        std::__cxx11::string::substr
                  ((ulong)&local_388,
                   (long)&((local_288.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_388);
        if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_388.size) {
          operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
        }
        gutil::trim((string *)this_01);
        __s = (local_3b0->filename)._M_dataplus._M_p;
        pcVar5 = (char *)(local_3b8->basepath)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)this_00,0,pcVar5,(ulong)__s);
        lVar12 = std::__cxx11::string::find_last_of((char *)this_00,0x128b1c,0xffffffffffffffff);
        if (lVar12 == -1) {
          std::__cxx11::string::_M_replace
                    ((ulong)this_00,0,(char *)(local_3b8->basepath)._M_string_length,0x128467);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_388,(ulong)this_00);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_388);
          if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_388.size) {
            operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
          }
        }
        if (bVar15) break;
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar14 < (ulong)((long)local_288.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_288.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_388.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_388.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"vertex","");
  local_248.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_248.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"scan_size","");
  pPVar8 = local_3b0;
  pVar9 = PLYReader::getTypeOfProperty(local_3b0,(string *)&local_388,(string *)&local_248);
  uVar14 = 1;
  if (pVar9 == ply_none) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"vertex","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"scan_error","");
    pVar10 = PLYReader::getTypeOfProperty(pPVar8,&local_b0,&local_d0);
    if (pVar10 != ply_none) goto LAB_00121079;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"vertex","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"scan_conf","");
    pVar10 = PLYReader::getTypeOfProperty(pPVar8,&local_f0,&local_110);
    uVar14 = (ulong)(pVar10 != ply_none);
    bVar15 = true;
  }
  else {
LAB_00121079:
    bVar15 = false;
  }
  local_268.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_268.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"vertex","");
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_3a8.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"sx","");
  pVar10 = PLYReader::getTypeOfProperty(pPVar8,(string *)&local_268,(string *)&local_3a8);
  if (pVar10 == ply_none) {
LAB_001211ce:
    bVar6 = false;
  }
  else {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"vertex","");
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"sy","");
    pVar11 = PLYReader::getTypeOfProperty(pPVar8,&local_130,&local_150);
    if (pVar11 == ply_none) goto LAB_001211ce;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"vertex","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"sz","");
    PLYReader::getTypeOfProperty(local_3b0,&local_170,&local_190);
    bVar6 = true;
  }
  (*(local_3b8->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(local_3b8,local_228,uVar14)
  ;
  pPVar8 = local_3b0;
  psVar1 = &local_3a8.size;
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  if (pVar10 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_268.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_268.size) {
    operator_delete(local_268.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar15) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  pTVar7 = local_3b8;
  if (pVar9 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if (local_248.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_248.size) {
    operator_delete(local_248.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_388.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_388.size) {
    operator_delete(local_388.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_388,(pTVar7->super_Mesh).super_PointCloud.vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_248,(pTVar7->super_Mesh).super_PointCloud.vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_268,(pTVar7->super_Mesh).super_PointCloud.vertex,3,2);
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"vertex","");
  psVar4 = &local_2a8.size;
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"x","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_3a8,(string *)&local_2a8,&local_388.super_PLYReceiver);
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"y","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_3a8,(string *)&local_2a8,&local_248.super_PLYReceiver);
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_3a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"vertex","");
  local_2a8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"z","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_3a8,(string *)&local_2a8,&local_268.super_PLYReceiver);
  if (local_2a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_2a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_3a8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_3a8.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_3a8,(pTVar7->super_Mesh).super_PointCloud.scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2a8,(pTVar7->super_Mesh).super_PointCloud.scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_50,(pTVar7->super_Mesh).super_PointCloud.scanprop,3,2);
  if ((pTVar7->super_Mesh).super_PointCloud.scanprop != (float *)0x0) {
    psVar1 = &local_2c8.size;
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    psVar4 = &local_2e8.size;
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_size","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_2c8,(string *)&local_2e8,&local_3a8.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_error","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_2c8,(string *)&local_2e8,&local_2a8.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_2c8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"vertex","");
    local_2e8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"scan_conf","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_2c8,(string *)&local_2e8,&local_50.super_PLYReceiver);
    if (local_2e8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_2e8.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_2c8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_2c8.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2c8,(pTVar7->super_Mesh).super_PointCloud.scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_2e8,(pTVar7->super_Mesh).super_PointCloud.scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver
            (&local_70,(pTVar7->super_Mesh).super_PointCloud.scanpos,3,2);
  if ((pTVar7->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    psVar1 = &local_308.size;
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    psVar4 = &local_328.size;
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sx","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_308,(string *)&local_328,&local_2c8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sy","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_308,(string *)&local_328,&local_2e8.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_308.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"vertex","");
    local_328.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"sz","");
    PLYReader::setReceiver
              (pPVar8,(string *)&local_308,(string *)&local_328,&local_70.super_PLYReceiver);
    if (local_328.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
      operator_delete(local_328.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_308.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_308.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_308,(pTVar7->super_Mesh).normal,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_328,(pTVar7->super_Mesh).normal,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_90,(pTVar7->super_Mesh).normal,3,2);
  psVar1 = &local_348.size;
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  psVar4 = &local_368.size;
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"nx","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_348,(string *)&local_368,&local_308.super_PLYReceiver);
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ny","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_348,(string *)&local_368,&local_328.super_PLYReceiver);
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_348.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"vertex","");
  local_368.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"nz","");
  PLYReader::setReceiver
            (pPVar8,(string *)&local_348,(string *)&local_368,&local_90.super_PLYReceiver);
  if (local_368.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar4) {
    operator_delete(local_368.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_348.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_348.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_348,pTVar7->uv,2,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_368,pTVar7->uv,2,1);
  paVar2 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  paVar3 = &local_3d8.field_2;
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"u","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"v","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"texture_u","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"texture_v","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"s","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_348.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"t","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_368.super_PLYReceiver);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  uVar14 = PLYReader::instancesOfElement(pPVar8,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  (*(pTVar7->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(pTVar7,uVar14 & 0xffffffff);
  local_220._vptr_PLYReceiver = (_func_int **)&PTR_setValue_00131998;
  local_218 = pTVar7;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vertex_index","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"face","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"vertex_indices","");
  PLYReader::setReceiver(pPVar8,&local_3f8,&local_3d8,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  PLYReader::readData(pPVar8);
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"vertex","");
  local_3d8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nx","");
  pVar9 = PLYReader::getTypeOfProperty(pPVar8,&local_3f8,&local_3d8);
  bVar15 = true;
  if (pVar9 != ply_none) {
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vertex","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"ny","");
    pVar10 = PLYReader::getTypeOfProperty(local_3b0,&local_210,&local_1b0);
    if (pVar10 != ply_none) {
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"vertex","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"nz","");
      pVar10 = PLYReader::getTypeOfProperty(local_3b0,&local_1d0,&local_1f0);
      bVar15 = pVar10 == ply_none;
      bVar6 = true;
      goto LAB_0012201b;
    }
  }
  bVar6 = false;
LAB_0012201b:
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
  }
  if (pVar9 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (bVar15) {
    Mesh::recalculateNormals(&local_3b8->super_Mesh);
  }
  else {
    Mesh::normalizeNormals(&local_3b8->super_Mesh);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return;
}

Assistant:

void TexturedMesh::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // get texture name

  basepath="";

  std::vector<std::string> comment;
  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    size_t k=comment[i].find("TextureFile");

    if (k != 0)
    {
      k=comment[i].find("texturefile");
    }

    if (k == 0)
    {
      name=comment[i].substr(11);
      gutil::trim(name);

      basepath=ply.getName();

      size_t j=basepath.find_last_of("/\\");

      if (j != basepath.npos)
      {
        basepath=basepath.substr(0, j+1);
      }
      else
      {
        basepath="";
      }

      break;
    }
  }

  // set receiver for vertices

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  FloatArrayReceiver nx(getNormalArray(), 3, 0), ny(getNormalArray(), 3, 1), nz(getNormalArray(), 3,
      2);

  ply.setReceiver("vertex", "nx", &nx);
  ply.setReceiver("vertex", "ny", &ny);
  ply.setReceiver("vertex", "nz", &nz);

  FloatArrayReceiver tu(getTextureCoordArray(), 2, 0), tv(getTextureCoordArray(), 2, 1);

  ply.setReceiver("vertex", "u", &tu);
  ply.setReceiver("vertex", "v", &tv);
  ply.setReceiver("vertex", "texture_u", &tu);
  ply.setReceiver("vertex", "texture_v", &tv);
  ply.setReceiver("vertex", "s", &tu);
  ply.setReceiver("vertex", "t", &tv);

  // set receiver for triangles

  int tn=static_cast<int>(ply.instancesOfElement("face"));

  resizeTriangleList(tn);

  TriangleReceiver tr(*this);

  ply.setReceiver("face", "vertex_index", &tr);
  ply.setReceiver("face", "vertex_indices", &tr);

  // read data and calculate normals

  ply.readData();

  if (ply.getTypeOfProperty("vertex", "nx") == ply_none ||
      ply.getTypeOfProperty("vertex", "ny") == ply_none ||
      ply.getTypeOfProperty("vertex", "nz") == ply_none)
  {
    recalculateNormals();
  }
  else
  {
    normalizeNormals();
  }
}